

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O2

void __thiscall foxxll::disk_config::parse_fileio(disk_config *this)

{
  string *__lhs;
  bool bVar1;
  long lVar2;
  ulong uVar3;
  ostream *poVar4;
  runtime_error *prVar5;
  pointer str;
  string local_220 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  eq;
  char *endp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  param;
  string paramstr;
  ostringstream msg;
  
  __lhs = &this->io_impl;
  lVar2 = std::__cxx11::string::find_first_not_of((char)__lhs,0x20);
  if (lVar2 != 0) {
    std::__cxx11::string::substr((ulong)&msg,(ulong)__lhs);
    std::__cxx11::string::operator=((string *)__lhs,(string *)&msg);
    std::__cxx11::string::~string((string *)&msg);
  }
  lVar2 = std::__cxx11::string::find((char)__lhs,0x20);
  if (lVar2 != -1) {
    std::__cxx11::string::substr((ulong)&paramstr,(ulong)__lhs);
    std::__cxx11::string::substr((ulong)&msg,(ulong)__lhs);
    std::__cxx11::string::operator=((string *)__lhs,(string *)&msg);
    std::__cxx11::string::~string((string *)&msg);
    tlx::split(&param,' ',&paramstr,0xffffffffffffffff);
    for (str = param.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
        str != param.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish; str = str + 1) {
      tlx::split(&eq,'=',str,2,2);
      bVar1 = std::operator==(str,"");
      if (bVar1) goto LAB_00145405;
      bVar1 = std::operator==(str,"autogrow");
      if (bVar1) {
LAB_00145385:
        bVar1 = std::operator==(str,"autogrow");
        if (bVar1) goto LAB_00145394;
        bVar1 = std::operator==(str,"noautogrow");
        if (!bVar1) {
          bVar1 = std::operator==(eq.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1,"off");
          if (!bVar1) {
            bVar1 = std::operator==(eq.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1,"on");
            if (!bVar1) {
              bVar1 = std::operator==(eq.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1,"no");
              if (bVar1) goto LAB_001453cb;
              bVar1 = std::operator==(eq.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1,"yes");
              if (!bVar1) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
                poVar4 = std::operator<<((ostream *)&msg,"Error in ");
                poVar4 = std::operator<<(poVar4,"void foxxll::disk_config::parse_fileio()");
                poVar4 = std::operator<<(poVar4," : ");
                poVar4 = std::operator<<(poVar4,"Invalid parameter \'");
                poVar4 = std::operator<<(poVar4,(string *)str);
                std::operator<<(poVar4,"\' in disk configuration file.");
                prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::__cxx11::stringbuf::str();
                std::runtime_error::runtime_error(prVar5,local_220);
                __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
            }
LAB_00145394:
            this->autogrow = true;
            goto LAB_00145405;
          }
        }
LAB_001453cb:
        this->autogrow = false;
      }
      else {
        bVar1 = std::operator==(str,"noautogrow");
        if (bVar1) goto LAB_00145385;
        bVar1 = std::operator==(eq.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,"autogrow");
        if (bVar1) goto LAB_00145385;
        bVar1 = std::operator==(str,"delete");
        if (bVar1) {
LAB_001453fc:
          this->delete_on_exit = true;
        }
        else {
          bVar1 = std::operator==(str,"delete_on_exit");
          if (bVar1) goto LAB_001453fc;
          bVar1 = std::operator==(str,"direct");
          if (bVar1) {
LAB_001454ad:
            bVar1 = std::operator==(str,"direct");
            if (bVar1) goto LAB_001454c0;
            bVar1 = std::operator==(str,"nodirect");
            if (!bVar1) {
              bVar1 = std::operator==(eq.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1,"off");
              if (!bVar1) {
                bVar1 = std::operator==(eq.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + 1,"try");
                if (bVar1) {
                  this->direct = DIRECT_TRY;
                  goto LAB_00145405;
                }
                bVar1 = std::operator==(eq.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + 1,"on");
                if (!bVar1) {
                  bVar1 = std::operator==(eq.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + 1,"no");
                  if (bVar1) goto LAB_001454fd;
                  bVar1 = std::operator==(eq.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + 1,"yes");
                  if (!bVar1) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
                    poVar4 = std::operator<<((ostream *)&msg,"Error in ");
                    poVar4 = std::operator<<(poVar4,"void foxxll::disk_config::parse_fileio()");
                    poVar4 = std::operator<<(poVar4," : ");
                    poVar4 = std::operator<<(poVar4,"Invalid parameter \'");
                    poVar4 = std::operator<<(poVar4,(string *)str);
                    std::operator<<(poVar4,"\' in disk configuration file.");
                    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::__cxx11::stringbuf::str();
                    std::runtime_error::runtime_error(prVar5,local_220);
                    __cxa_throw(prVar5,&std::runtime_error::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                }
LAB_001454c0:
                this->direct = DIRECT_ON;
                goto LAB_00145405;
              }
            }
LAB_001454fd:
            this->direct = DIRECT_OFF;
          }
          else {
            bVar1 = std::operator==(str,"nodirect");
            if (bVar1) goto LAB_001454ad;
            bVar1 = std::operator==(eq.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start,"direct");
            if (bVar1) goto LAB_001454ad;
            bVar1 = std::operator==(eq.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start,"queue");
            if (bVar1) {
              bVar1 = std::operator==(__lhs,"linuxaio");
              if (bVar1) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
                poVar4 = std::operator<<((ostream *)&msg,"Error in ");
                poVar4 = std::operator<<(poVar4,"void foxxll::disk_config::parse_fileio()");
                poVar4 = std::operator<<(poVar4," : ");
                poVar4 = std::operator<<(poVar4,"Parameter \'");
                poVar4 = std::operator<<(poVar4,(string *)str);
                poVar4 = std::operator<<(poVar4,"\' invalid for fileio \'");
                poVar4 = std::operator<<(poVar4,(string *)__lhs);
                std::operator<<(poVar4,"\' in disk configuration file.");
                prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::__cxx11::stringbuf::str();
                std::runtime_error::runtime_error(prVar5,local_220);
                __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
              uVar3 = strtoul(eq.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p,&endp,10
                             );
              this->queue = (int)uVar3;
              if ((endp != (char *)0x0) && (*endp != '\0')) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
                poVar4 = std::operator<<((ostream *)&msg,"Error in ");
                poVar4 = std::operator<<(poVar4,"void foxxll::disk_config::parse_fileio()");
                poVar4 = std::operator<<(poVar4," : ");
                poVar4 = std::operator<<(poVar4,"Invalid parameter \'");
                poVar4 = std::operator<<(poVar4,(string *)str);
                std::operator<<(poVar4,"\' in disk configuration file.");
                prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::__cxx11::stringbuf::str();
                std::runtime_error::runtime_error(prVar5,local_220);
                __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
            }
            else {
              bVar1 = std::operator==(eq.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start,"queue_length");
              if (bVar1) {
                bVar1 = std::operator!=(__lhs,"linuxaio");
                if (bVar1) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
                  poVar4 = std::operator<<((ostream *)&msg,"Error in ");
                  poVar4 = std::operator<<(poVar4,"void foxxll::disk_config::parse_fileio()");
                  poVar4 = std::operator<<(poVar4," : ");
                  poVar4 = std::operator<<(poVar4,"Parameter \'");
                  poVar4 = std::operator<<(poVar4,(string *)str);
                  std::operator<<(poVar4,
                                  "\' is only valid for fileio linuxaio in disk configuration file."
                                 );
                  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::__cxx11::stringbuf::str();
                  std::runtime_error::runtime_error(prVar5,local_220);
                  __cxa_throw(prVar5,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                uVar3 = strtoul(eq.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p,&endp,
                                10);
                this->queue_length = (int)uVar3;
                if ((endp != (char *)0x0) && (*endp != '\0')) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
                  poVar4 = std::operator<<((ostream *)&msg,"Error in ");
                  poVar4 = std::operator<<(poVar4,"void foxxll::disk_config::parse_fileio()");
                  poVar4 = std::operator<<(poVar4," : ");
                  poVar4 = std::operator<<(poVar4,"Invalid parameter \'");
                  poVar4 = std::operator<<(poVar4,(string *)str);
                  std::operator<<(poVar4,"\' in disk configuration file.");
                  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::__cxx11::stringbuf::str();
                  std::runtime_error::runtime_error(prVar5,local_220);
                  __cxa_throw(prVar5,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
              }
              else {
                bVar1 = std::operator==(eq.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start,"device_id");
                if (!bVar1) {
                  bVar1 = std::operator==(eq.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start,"devid");
                  if (!bVar1) {
                    bVar1 = std::operator==(str,"raw_device");
                    if (bVar1) {
                      bVar1 = std::operator==(__lhs,"syscall");
                      if (!bVar1) {
                        std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
                        poVar4 = std::operator<<((ostream *)&msg,"Error in ");
                        poVar4 = std::operator<<(poVar4,"void foxxll::disk_config::parse_fileio()");
                        poVar4 = std::operator<<(poVar4," : ");
                        poVar4 = std::operator<<(poVar4,"Parameter \'");
                        poVar4 = std::operator<<(poVar4,(string *)str);
                        poVar4 = std::operator<<(poVar4,"\' invalid for fileio \'");
                        poVar4 = std::operator<<(poVar4,(string *)__lhs);
                        std::operator<<(poVar4,"\' in disk configuration file.");
                        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
                        std::__cxx11::stringbuf::str();
                        std::runtime_error::runtime_error(prVar5,local_220);
                        __cxa_throw(prVar5,&std::runtime_error::typeinfo,
                                    std::runtime_error::~runtime_error);
                      }
                      this->raw_device = true;
                    }
                    else {
                      bVar1 = std::operator==(str,"unlink");
                      if (!bVar1) {
                        bVar1 = std::operator==(str,"unlink_on_open");
                        if (!bVar1) {
                          std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
                          poVar4 = std::operator<<((ostream *)&msg,"Error in ");
                          poVar4 = std::operator<<(poVar4,"void foxxll::disk_config::parse_fileio()"
                                                  );
                          poVar4 = std::operator<<(poVar4," : ");
                          poVar4 = std::operator<<(poVar4,"Invalid optional parameter \'");
                          poVar4 = std::operator<<(poVar4,(string *)str);
                          std::operator<<(poVar4,"\' in disk configuration file.");
                          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
                          std::__cxx11::stringbuf::str();
                          std::runtime_error::runtime_error(prVar5,local_220);
                          __cxa_throw(prVar5,&std::runtime_error::typeinfo,
                                      std::runtime_error::~runtime_error);
                        }
                      }
                      bVar1 = std::operator==(__lhs,"syscall");
                      if (!bVar1) {
                        bVar1 = std::operator==(__lhs,"linuxaio");
                        if (!bVar1) {
                          bVar1 = std::operator==(__lhs,"mmap");
                          if (!bVar1) {
                            std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
                            poVar4 = std::operator<<((ostream *)&msg,"Error in ");
                            poVar4 = std::operator<<(poVar4,
                                                  "void foxxll::disk_config::parse_fileio()");
                            poVar4 = std::operator<<(poVar4," : ");
                            poVar4 = std::operator<<(poVar4,"Parameter \'");
                            poVar4 = std::operator<<(poVar4,(string *)str);
                            poVar4 = std::operator<<(poVar4,"\' invalid for fileio \'");
                            poVar4 = std::operator<<(poVar4,(string *)__lhs);
                            std::operator<<(poVar4,"\' in disk configuration file.");
                            prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
                            std::__cxx11::stringbuf::str();
                            std::runtime_error::runtime_error(prVar5,local_220);
                            __cxa_throw(prVar5,&std::runtime_error::typeinfo,
                                        std::runtime_error::~runtime_error);
                          }
                        }
                      }
                      this->unlink_on_open = true;
                    }
                    goto LAB_00145405;
                  }
                }
                uVar3 = strtoul(eq.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p,&endp,
                                10);
                this->device_id = (uint)uVar3;
                if ((endp != (char *)0x0) && (*endp != '\0')) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
                  poVar4 = std::operator<<((ostream *)&msg,"Error in ");
                  poVar4 = std::operator<<(poVar4,"void foxxll::disk_config::parse_fileio()");
                  poVar4 = std::operator<<(poVar4," : ");
                  poVar4 = std::operator<<(poVar4,"Invalid parameter \'");
                  poVar4 = std::operator<<(poVar4,(string *)str);
                  std::operator<<(poVar4,"\' in disk configuration file.");
                  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::__cxx11::stringbuf::str();
                  std::runtime_error::runtime_error(prVar5,local_220);
                  __cxa_throw(prVar5,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
              }
            }
          }
        }
      }
LAB_00145405:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&eq);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&param);
    std::__cxx11::string::~string((string *)&paramstr);
  }
  return;
}

Assistant:

void disk_config::parse_fileio()
{
    // skip over leading spaces
    size_t leadspace = io_impl.find_first_not_of(' ');
    if (leadspace > 0)
        io_impl = io_impl.substr(leadspace);

    // split off extra fileio parameters
    size_t spacepos = io_impl.find(' ');
    if (spacepos == std::string::npos)
        return; // no space in fileio

    // *** Parse Extra Fileio Parameters ***

    std::string paramstr = io_impl.substr(spacepos + 1);
    io_impl = io_impl.substr(0, spacepos);

    std::vector<std::string> param = tlx::split(' ', paramstr);

    for (std::vector<std::string>::const_iterator p = param.begin();
         p != param.end(); ++p)
    {
        // split at equal sign
        std::vector<std::string> eq = tlx::split('=', *p, 2, 2);

        // *** PLEASE try to keep the elseifs sorted by parameter name!
        if (*p == "") {
            // skip blank options
        }
        else if (*p == "autogrow" || *p == "noautogrow" || eq[0] == "autogrow")
        {
            // TODO: which fileio implementation support autogrow?

            if (*p == "autogrow") autogrow = true;
            else if (*p == "noautogrow") autogrow = false;
            else if (eq[1] == "off") autogrow = false;
            else if (eq[1] == "on") autogrow = true;
            else if (eq[1] == "no") autogrow = false;
            else if (eq[1] == "yes") autogrow = true;
            else
            {
                FOXXLL_THROW(
                    std::runtime_error,
                    "Invalid parameter '" << *p << "' in disk configuration file."
                );
            }
        }
        else if (*p == "delete" || *p == "delete_on_exit")
        {
            delete_on_exit = true;
        }
        else if (*p == "direct" || *p == "nodirect" || eq[0] == "direct")
        {
            // io_impl is not checked here, but I guess that is okay for DIRECT
            // since it depends highly platform _and_ build-time configuration.

            if (*p == "direct") direct = DIRECT_ON;          // force ON
            else if (*p == "nodirect") direct = DIRECT_OFF;  // force OFF
            else if (eq[1] == "off") direct = DIRECT_OFF;
            else if (eq[1] == "try") direct = DIRECT_TRY;
            else if (eq[1] == "on") direct = DIRECT_ON;
            else if (eq[1] == "no") direct = DIRECT_OFF;
            else if (eq[1] == "yes") direct = DIRECT_ON;
            else
            {
                FOXXLL_THROW(
                    std::runtime_error,
                    "Invalid parameter '" << *p << "' in disk configuration file."
                );
            }
        }
        else if (eq[0] == "queue")
        {
            if (io_impl == "linuxaio") {
                FOXXLL_THROW(std::runtime_error, "Parameter '" << *p << "' invalid for fileio '" << io_impl << "' in disk configuration file.");
            }

            char* endp;
            queue = static_cast<int>(strtoul(eq[1].c_str(), &endp, 10));
            if (endp && *endp != 0) {
                FOXXLL_THROW(
                    std::runtime_error,
                    "Invalid parameter '" << *p << "' in disk configuration file."
                );
            }
        }
        else if (eq[0] == "queue_length")
        {
            if (io_impl != "linuxaio") {
                FOXXLL_THROW(
                    std::runtime_error, "Parameter '" << *p << "' "
                        "is only valid for fileio linuxaio "
                        "in disk configuration file."
                );
            }

            char* endp;
            queue_length = static_cast<int>(strtoul(eq[1].c_str(), &endp, 10));
            if (endp && *endp != 0) {
                FOXXLL_THROW(
                    std::runtime_error,
                    "Invalid parameter '" << *p << "' in disk configuration file."
                );
            }
        }
        else if (eq[0] == "device_id" || eq[0] == "devid")
        {
            char* endp;
            device_id = static_cast<int>(strtoul(eq[1].c_str(), &endp, 10));
            if (endp && *endp != 0) {
                FOXXLL_THROW(
                    std::runtime_error,
                    "Invalid parameter '" << *p << "' in disk configuration file."
                );
            }
        }
        else if (*p == "raw_device")
        {
            if (!(io_impl == "syscall")) {
                FOXXLL_THROW(std::runtime_error, "Parameter '" << *p << "' invalid for fileio '" << io_impl << "' in disk configuration file.");
            }

            raw_device = true;
        }
        else if (*p == "unlink" || *p == "unlink_on_open")
        {
            if (!(io_impl == "syscall" || io_impl == "linuxaio" ||
                  io_impl == "mmap"))
            {
                FOXXLL_THROW(std::runtime_error, "Parameter '" << *p << "' invalid for fileio '" << io_impl << "' in disk configuration file.");
            }

            unlink_on_open = true;
        }
        else
        {
            FOXXLL_THROW(
                std::runtime_error,
                "Invalid optional parameter '" << *p << "' in disk configuration file."
            );
        }
    }
}